

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_BMP_Image.cxx
# Opt level: O1

void __thiscall Fl_BMP_Image::Fl_BMP_Image(Fl_BMP_Image *this,char *bmp)

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  FILE *__stream;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uchar *puVar23;
  uchar uVar24;
  char cVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  uchar colormap [256] [3];
  uint local_398;
  uint local_390;
  uint local_36c;
  uchar local_338 [776];
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_RGB_Image_0027ba10;
  __stream = (FILE *)fl_fopen(bmp,"rb");
  if (__stream == (FILE *)0x0) {
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
    return;
  }
  iVar11 = getc(__stream);
  uVar12 = getc(__stream);
  if (((char)iVar11 != 'B') || ((uVar12 & 0xff) != 0x4d)) {
    fclose(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
    return;
  }
  read_dword((FILE *)__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  uVar12 = read_dword((FILE *)__stream);
  uVar13 = read_dword((FILE *)__stream);
  if ((int)uVar13 < 0x28) {
    uVar14 = getc(__stream);
    uVar15 = getc(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = (uVar15 & 0xff) << 8 | uVar14 & 0xff;
    uVar14 = getc(__stream);
    uVar15 = getc(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = (uVar15 & 0xff) << 8 | uVar14 & 0xff;
    getc(__stream);
    getc(__stream);
    uVar14 = getc(__stream);
    uVar15 = getc(__stream);
    uVar26 = (uVar15 & 0xff) << 8 | uVar14 & 0xff;
    iVar11 = uVar13 - 0xc;
    uVar28 = 3;
    uVar22 = 0;
    bVar29 = true;
    local_36c = 0xffffffff;
  }
  else {
    iVar11 = read_long((FILE *)__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = iVar11;
    uVar15 = read_long((FILE *)__stream);
    local_36c = (int)~uVar15 >> 0x1f | 1;
    uVar14 = -uVar15;
    if (0 < (int)uVar15) {
      uVar14 = uVar15;
    }
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = uVar14;
    getc(__stream);
    getc(__stream);
    uVar14 = getc(__stream);
    iVar27 = getc(__stream);
    uVar26 = uVar14 & 0xff | iVar27 << 8 & 0xffffU;
    local_398 = read_dword((FILE *)__stream);
    uVar15 = read_dword((FILE *)__stream);
    read_long((FILE *)__stream);
    read_long((FILE *)__stream);
    uVar22 = read_dword((FILE *)__stream);
    read_dword((FILE *)__stream);
    iVar11 = uVar13 - 0x28;
    uVar28 = 3;
    bVar29 = true;
    if (((uVar14 & 0xff | iVar27 << 8) & 0xfff8) == 0 || local_398 != 0) goto LAB_0020a8e4;
    iVar27 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
    local_398 = 0;
    if (iVar27 <= (int)(0x20 / (ulong)uVar26)) goto LAB_0020a8e4;
    iVar17 = (this->super_Fl_RGB_Image).super_Fl_Image.h_;
    iVar19 = iVar27 + 0xe;
    if (-1 < iVar27 + 7) {
      iVar19 = iVar27 + 7;
    }
    bVar29 = (((iVar19 >> 3) + 3U & 0xfffffffc) + ((uVar26 >> 3) * iVar27 + 3 & 0xfffffffc)) *
             iVar17 != uVar15 * 2;
    if (bVar29) goto LAB_0020a8e4;
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = iVar17 / 2;
    uVar28 = 4;
    bVar29 = false;
  }
  local_398 = 0;
LAB_0020a8e4:
  if (0 < iVar11) {
    iVar11 = iVar11 + 1;
    do {
      getc(__stream);
      iVar11 = iVar11 + -1;
    } while (1 < iVar11);
  }
  if ((((this->super_Fl_RGB_Image).super_Fl_Image.w_ == 0) || (uVar26 == 0)) ||
     ((this->super_Fl_RGB_Image).super_Fl_Image.h_ == 0)) {
    fclose(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  }
  else {
    uVar14 = 1 << ((byte)uVar26 & 0x1f);
    if (8 < uVar26) {
      uVar14 = uVar22;
    }
    if (uVar22 != 0) {
      uVar14 = uVar22;
    }
    if (0 < (int)uVar14) {
      uVar21 = (ulong)uVar14;
      puVar23 = local_338;
      do {
        fread(puVar23,1,3,__stream);
        if (0xc < (int)uVar13) {
          getc(__stream);
        }
        puVar23 = puVar23 + 3;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    bVar31 = true;
    if (uVar26 == 0x10) {
      uVar13 = read_dword((FILE *)__stream);
      bVar31 = uVar13 != 0xf800;
    }
    if (uVar26 == 0x20) {
      uVar28 = 4;
    }
    (this->super_Fl_RGB_Image).super_Fl_Image.d_ = uVar28;
    if (uVar12 != 0) {
      fseek(__stream,(ulong)uVar12,0);
    }
    uVar12 = (this->super_Fl_RGB_Image).super_Fl_Image.h_;
    uVar21 = (long)(this->super_Fl_RGB_Image).super_Fl_Image.d_ *
             (long)(this->super_Fl_RGB_Image).super_Fl_Image.w_ * (long)(int)uVar12;
    if (uVar21 < Fl_RGB_Image::max_size_ || uVar21 - Fl_RGB_Image::max_size_ == 0) {
      puVar23 = (uchar *)operator_new__(uVar21);
      (this->super_Fl_RGB_Image).array = puVar23;
      local_390 = (int)local_36c >> 0x1f & uVar12 - 1;
      if ((int)local_36c < 0) {
        uVar12 = 0xffffffff;
      }
      (this->super_Fl_RGB_Image).alloc_array = 1;
      uVar13 = 0;
      uVar14 = 0;
      if (local_390 != uVar12) {
        uVar22 = 0;
        uVar20 = 0;
        uVar15 = 0;
        do {
          uVar9 = local_338[5];
          uVar8 = local_338[4];
          uVar7 = local_338[3];
          uVar6 = local_338[2];
          uVar5 = local_338[1];
          uVar4 = local_338[0];
          puVar23 = (this->super_Fl_RGB_Image).array;
          iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
          iVar27 = (this->super_Fl_RGB_Image).super_Fl_Image.d_;
          if (uVar26 < 0x10) {
            puVar23 = puVar23 + (int)(iVar11 * local_390 * iVar27);
            if (uVar26 == 1) {
              if (0 < iVar11) {
                iVar11 = iVar11 + 1;
                uVar15 = 0x80;
                do {
                  if (uVar15 == 0x80) {
                    uVar14 = getc(__stream);
                  }
                  uVar24 = uVar7;
                  uVar2 = uVar9;
                  uVar3 = uVar8;
                  if ((uVar15 & uVar14 & 0xff) == 0) {
                    uVar24 = uVar4;
                    uVar2 = uVar6;
                    uVar3 = uVar5;
                  }
                  *puVar23 = uVar2;
                  puVar23[1] = uVar3;
                  bVar30 = uVar15 < 2;
                  uVar15 = uVar15 >> 1;
                  if (bVar30) {
                    uVar15 = 0x80;
                  }
                  puVar23[2] = uVar24;
                  iVar11 = iVar11 + -1;
                  puVar23 = puVar23 + 3;
                } while (1 < iVar11);
              }
              iVar27 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
              iVar11 = iVar27 + 7;
              iVar27 = iVar27 + 0xe;
              if (-1 < iVar11) {
                iVar27 = iVar11;
              }
              for (uVar15 = iVar27 >> 3; (uVar15 & 3) != 0; uVar15 = uVar15 + 1) {
                getc(__stream);
              }
            }
            else if (uVar26 == 4) {
              if (0 < iVar11) {
                cVar25 = -0x10;
LAB_0020afb7:
                uVar18 = 2;
                if (uVar22 != 0) {
                  uVar18 = uVar22;
                }
                if (uVar22 == 0 && local_398 == 2) {
                  if (uVar20 != 0) {
                    iVar27 = uVar20 + 1;
                    do {
                      getc(__stream);
                      iVar27 = iVar27 + -1;
                    } while (1 < iVar27);
                    uVar20 = 0;
                  }
                  uVar18 = getc(__stream);
                  uVar22 = getc(__stream);
                  uVar16 = uVar22;
                  if (uVar18 != 0) goto LAB_0020b02c;
                  if (uVar22 == 0) {
                    iVar27 = iVar11 + 1;
                    uVar22 = 0;
                    goto LAB_0020b0bb;
                  }
                  if (uVar22 == 2) {
                    iVar27 = getc(__stream);
                    iVar17 = getc(__stream);
                    uVar18 = iVar17 * iVar27 * (this->super_Fl_RGB_Image).super_Fl_Image.w_;
                    uVar16 = 0;
                    goto LAB_0020b02c;
                  }
                  if (uVar22 == 1) goto LAB_0020b203;
                  uVar20 = -uVar22 >> 1 & 1;
                  uVar18 = uVar22;
                  uVar16 = 0xffffffff;
                }
                else {
                  uVar16 = uVar13 | -(uint)(uVar22 == 0);
                }
LAB_0020b02c:
                uVar22 = uVar18 - 1;
                iVar27 = iVar11;
                uVar13 = uVar16;
                if (cVar25 == -0x10) {
                  uVar15 = uVar16;
                  if ((int)uVar16 < 0) {
                    uVar15 = getc(__stream);
                  }
                  lVar1 = (ulong)(uVar15 >> 4 & 0xf) * 3;
                  *puVar23 = local_338[lVar1 + 2];
                  puVar23[1] = local_338[lVar1 + 1];
                  puVar23[2] = local_338[lVar1];
                  puVar23 = puVar23 + 3;
                  cVar25 = '\x0f';
                }
                else {
                  lVar1 = (ulong)(uVar15 & 0xf) * 3;
                  *puVar23 = local_338[lVar1 + 2];
                  puVar23[1] = local_338[lVar1 + 1];
                  puVar23[2] = local_338[lVar1];
                  puVar23 = puVar23 + 3;
                  cVar25 = -0x10;
                }
LAB_0020b0bb:
                iVar11 = iVar27 + -1;
                if (iVar27 < 2) goto LAB_0020b203;
                goto LAB_0020afb7;
              }
LAB_0020b203:
              if (local_398 == 0) {
                iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
                for (uVar15 = (iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1; (uVar15 & 3) != 0;
                    uVar15 = uVar15 + 1) {
                  getc(__stream);
                }
              }
            }
            else if (uVar26 == 8) {
              if (0 < iVar11) {
LAB_0020ac1d:
                if (local_398 != 1) {
                  uVar13 = 0xffffffff;
                  uVar22 = 1;
                }
                uVar18 = uVar13;
                uVar16 = uVar22;
                if (uVar22 == 0) {
                  if (uVar20 != 0) {
                    iVar27 = uVar20 + 1;
                    do {
                      getc(__stream);
                      iVar27 = iVar27 + -1;
                    } while (1 < iVar27);
                    uVar20 = 0;
                  }
                  uVar16 = getc(__stream);
                  uVar22 = getc(__stream);
                  uVar18 = uVar22;
                  if (uVar16 != 0) goto LAB_0020ac75;
                  if (uVar22 == 0) goto LAB_0020acca;
                  if (uVar22 == 2) {
                    iVar27 = getc(__stream);
                    iVar17 = getc(__stream);
                    uVar16 = iVar17 * iVar27 * (this->super_Fl_RGB_Image).super_Fl_Image.w_;
                    uVar18 = 0;
                    goto LAB_0020ac75;
                  }
                  if (uVar22 == 1) goto LAB_0020af95;
                  uVar20 = uVar22 & 1;
                  uVar18 = 0xffffffff;
                  uVar16 = uVar22;
                }
LAB_0020ac75:
                uVar15 = uVar18;
                if ((int)uVar18 < 0) {
                  uVar15 = getc(__stream);
                }
                uVar22 = uVar16 - 1;
                lVar1 = (long)(int)uVar15 * 3;
                *puVar23 = local_338[lVar1 + 2];
                puVar23[1] = local_338[lVar1 + 1];
                puVar23[2] = local_338[lVar1];
                puVar23 = puVar23 + (4 - (ulong)bVar29);
                iVar11 = iVar11 + -1;
                uVar13 = uVar18;
LAB_0020acca:
                if (iVar11 < 1) goto LAB_0020af95;
                goto LAB_0020ac1d;
              }
LAB_0020af95:
              if (local_398 == 0) {
                for (uVar15 = (this->super_Fl_RGB_Image).super_Fl_Image.w_; (uVar15 & 3) != 0;
                    uVar15 = uVar15 + 1) {
                  getc(__stream);
                }
              }
            }
          }
          else if (uVar26 == 0x10) {
            if (0 < iVar11) {
              iVar17 = iVar11 + 1;
              puVar23 = puVar23 + (long)(int)(iVar27 * iVar11 * local_390) + 2;
              do {
                uVar15 = getc(__stream);
                iVar11 = getc(__stream);
                bVar10 = (byte)iVar11;
                *puVar23 = (char)uVar15 * '\b';
                if (bVar31) {
                  puVar23[-1] = (byte)(uVar15 >> 2) & 0x38 | (byte)(iVar11 << 6);
                  bVar10 = bVar10 * '\x02';
                }
                else {
                  puVar23[-1] = (byte)(uVar15 >> 3) & 0x1c | (byte)(iVar11 << 5);
                }
                puVar23[-2] = bVar10 & 0xf8;
                iVar17 = iVar17 + -1;
                puVar23 = puVar23 + uVar28;
              } while (1 < iVar17);
            }
            uVar18 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
            uVar15 = uVar18 * 2;
            uVar18 = uVar18 & 1;
            while (uVar18 != 0) {
              getc(__stream);
              uVar15 = uVar15 + 1;
              uVar18 = uVar15 & 3;
            }
          }
          else if (uVar26 == 0x18) {
            if (0 < iVar11) {
              iVar17 = iVar11 + 1;
              puVar23 = puVar23 + (long)(int)(iVar27 * iVar11 * local_390) + 2;
              do {
                iVar11 = getc(__stream);
                *puVar23 = (uchar)iVar11;
                iVar11 = getc(__stream);
                puVar23[-1] = (uchar)iVar11;
                iVar11 = getc(__stream);
                puVar23[-2] = (uchar)iVar11;
                iVar17 = iVar17 + -1;
                puVar23 = puVar23 + uVar28;
              } while (1 < iVar17);
            }
            iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
            uVar15 = iVar11 * 3;
            if ((uVar15 & 3) != 0) {
              uVar18 = uVar15;
              do {
                uVar18 = uVar18 + 1;
                getc(__stream);
              } while ((uVar18 & 3) != 0);
              uVar15 = uVar15 + (iVar11 - 1U & 3) + 1;
            }
          }
          else if ((uVar26 == 0x20) && (0 < iVar11)) {
            iVar17 = iVar11 + 1;
            puVar23 = puVar23 + (long)(int)(iVar27 * iVar11 * local_390) + 3;
            do {
              iVar11 = getc(__stream);
              puVar23[-1] = (uchar)iVar11;
              iVar11 = getc(__stream);
              puVar23[-2] = (uchar)iVar11;
              iVar11 = getc(__stream);
              puVar23[-3] = (uchar)iVar11;
              iVar11 = getc(__stream);
              *puVar23 = (uchar)iVar11;
              iVar17 = iVar17 + -1;
              puVar23 = puVar23 + uVar28;
            } while (1 < iVar17);
          }
          local_390 = local_390 + local_36c;
        } while (local_390 != uVar12);
      }
      if ((bVar29 == false) && (iVar11 = (this->super_Fl_RGB_Image).super_Fl_Image.h_, 0 < iVar11))
      {
        do {
          iVar27 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
          if (0 < iVar27) {
            puVar23 = (this->super_Fl_RGB_Image).array +
                      (long)(iVar27 * (iVar11 + -1)) *
                      (long)(this->super_Fl_RGB_Image).super_Fl_Image.d_ + 3;
            iVar27 = iVar27 + 1;
            uVar12 = 0x80;
            do {
              if (uVar12 == 0x80) {
                uVar14 = getc(__stream);
              }
              uVar13 = uVar12 & uVar14 & 0xff;
              bVar29 = uVar12 < 2;
              uVar12 = uVar12 >> 1;
              if (bVar29) {
                uVar12 = 0x80;
              }
              *puVar23 = -(uVar13 == 0);
              puVar23 = puVar23 + uVar28;
              iVar27 = iVar27 + -1;
            } while (1 < iVar27);
          }
          iVar17 = (this->super_Fl_RGB_Image).super_Fl_Image.w_;
          iVar27 = iVar17 + 7;
          iVar17 = iVar17 + 0xe;
          if (-1 < iVar27) {
            iVar17 = iVar27;
          }
          for (uVar12 = iVar17 >> 3; (uVar12 & 3) != 0; uVar12 = uVar12 + 1) {
            getc(__stream);
          }
          bVar29 = 1 < iVar11;
          iVar11 = iVar11 + -1;
        } while (bVar29);
      }
      fclose(__stream);
      return;
    }
    (*Fl::warning)("BMP file \"%s\" is too large!\n",bmp);
    fclose(__stream);
    (this->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
    (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  }
  return;
}

Assistant:

Fl_BMP_Image::Fl_BMP_Image(const char *bmp) // I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		info_size,	// Size of info header
		depth,		// Depth of image (bits)
		bDepth = 3,	// Depth of image (bytes)
		compression,	// Type of compression
		colors_used,	// Number of colors used
		x, y,		// Looping vars
		color,		// Color of RLE pixel
		repcount,	// Number of times to repeat
		temp,		// Temporary color
		align,		// Alignment bytes
		dataSize,	// number of bytes in image data set
		row_order,	// 1 = normal;  -1 = flipped row order
		start_y,	// Beginning Y
		end_y;		// Ending Y
  long		offbits;	// Offset to image data
  uchar		bit,		// Bit in image
		byte;		// Byte in image
  uchar		*ptr;		// Pointer into pixels
  uchar		colormap[256][3];// Colormap
  uchar		havemask;	// Single bit mask follows image data
  int		use_5_6_5;	// Use 5:6:5 for R:G:B channels in 16 bit images


  // Open the file...
  if ((fp = fl_fopen(bmp, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  // Get the header...
  byte = (uchar)getc(fp);	// Check "BM" sync chars
  bit  = (uchar)getc(fp);
  if (byte != 'B' || bit != 'M') {
    fclose(fp);
    ld(ERR_FORMAT);
    return;
  }

  read_dword(fp);		// Skip size
  read_word(fp);		// Skip reserved stuff
  read_word(fp);
  offbits = (long)read_dword(fp);// Read offset to image data

  // Then the bitmap information...
  info_size = read_dword(fp);

//  printf("offbits = %ld, info_size = %d\n", offbits, info_size);

  havemask  = 0;
  row_order = -1;
  use_5_6_5 = 0;

  if (info_size < 40) {
    // Old Windows/OS2 BMP header...
    w(read_word(fp));
    h(read_word(fp));
    read_word(fp);
    depth = read_word(fp);
    compression = BI_RGB;
    colors_used = 0;

    repcount = info_size - 12;
  } else {
    // New BMP header...
    w(read_long(fp));
    // If the height is negative, the row order is flipped
    temp = read_long(fp);
    if (temp < 0) row_order = 1;
    h(abs(temp));
    read_word(fp);
    depth = read_word(fp);
    compression = read_dword(fp);
    dataSize = read_dword(fp);
    read_long(fp);
    read_long(fp);
    colors_used = read_dword(fp);
    read_dword(fp);

    repcount = info_size - 40;

    if (!compression && depth>=8 && w()>32/depth) {
      int Bpp = depth/8;
      int maskSize = (((w()*Bpp+3)&~3)*h()) + (((((w()+7)/8)+3)&~3)*h());
      if (maskSize==2*dataSize) {
        havemask = 1;
	h(h()/2);
	bDepth = 4;
      }
    }
  }

//  printf("w() = %d, h() = %d, depth = %d, compression = %d, colors_used = %d, repcount = %d\n",
//         w(), h(), depth, compression, colors_used, repcount);

  // Skip remaining header bytes...
  while (repcount > 0) {
    getc(fp);
    repcount --;
  }

  // Check header data...
  if (!w() || !h() || !depth) {
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }

  // Get colormap...
  if (colors_used == 0 && depth <= 8)
    colors_used = 1 << depth;

  for (repcount = 0; repcount < colors_used; repcount ++) {
    // Read BGR color...
    if (fread(colormap[repcount], 1, 3, fp)==0) { /* ignore */ }

    // Skip pad byte for new BMP files...
    if (info_size > 12) getc(fp);
  }

  // Read first dword of colormap. It tells us if 5:5:5 or 5:6:5 for 16 bit
  if (depth == 16)
    use_5_6_5 = (read_dword(fp) == 0xf800);

  // Set byte depth for RGBA images
  if (depth == 32)
    bDepth=4;

  // Setup image and buffers...
  d(bDepth);
  if (offbits) fseek(fp, offbits, SEEK_SET);

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("BMP file \"%s\" is too large!\n", bmp);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image data...
  color = 0;
  repcount = 0;
  align = 0;
  byte  = 0;
  temp  = 0;

  if (row_order < 0) {
    start_y = h() - 1;
    end_y   = -1;
  } else {
    start_y = 0;
    end_y   = h();
  }

  for (y = start_y; y != end_y; y += row_order) {
    ptr = (uchar *)array + y * w() * d();

    switch (depth)
    {
      case 1 : // Bitmap
          for (x = w(), bit = 128; x > 0; x --) {
	    if (bit == 128) byte = (uchar)getc(fp);

	    if (byte & bit) {
	      *ptr++ = colormap[1][2];
	      *ptr++ = colormap[1][1];
	      *ptr++ = colormap[1][0];
	    } else {
	      *ptr++ = colormap[0][2];
	      *ptr++ = colormap[0][1];
	      *ptr++ = colormap[0][0];
	    }

	    if (bit > 1)
	      bit >>= 1;
	    else
	      bit = 128;
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = (w() + 7) / 8; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 4 : // 16-color
          for (x = w(), bit = 0xf0; x > 0; x --) {
	    // Get a new repcount as needed...
	    if (repcount == 0) {
              if (compression != BI_RLE4) {
		repcount = 2;
		color = -1;
              } else {
		while (align > 0) {
	          align --;
		  getc(fp);
        	}

		if ((repcount = getc(fp)) == 0) {
		  if ((repcount = getc(fp)) == 0) {
		    // End of line...
                    x ++;
		    continue;
		  } else if (repcount == 1) {
                    // End of image...
		    break;
		  } else if (repcount == 2) {
		    // Delta...
		    repcount = getc(fp) * getc(fp) * w();
		    color = 0;
		  } else {
		    // Absolute...
		    color = -1;
		    align = ((4 - (repcount & 3)) / 2) & 1;
		  }
		} else {
	          color = getc(fp);
		}
	      }
	    }

            // Get a new color as needed...
	    repcount --;

	    // Extract the next pixel...
            if (bit == 0xf0) {
	      // Get the next color byte as needed...
              if (color < 0) temp = getc(fp);
	      else temp = color;

              // Copy the color value...
	      *ptr++ = colormap[(temp >> 4) & 15][2];
	      *ptr++ = colormap[(temp >> 4) & 15][1];
	      *ptr++ = colormap[(temp >> 4) & 15][0];

	      bit  = 0x0f;
	    } else {
	      bit  = 0xf0;

              // Copy the color value...
	      *ptr++ = colormap[temp & 15][2];
	      *ptr++ = colormap[temp & 15][1];
	      *ptr++ = colormap[temp & 15][0];
	    }

	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = (w() + 1) / 2; temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 8 : // 256-color
          for (x = w(); x > 0; x --) {
	    // Get a new repcount as needed...
            if (compression != BI_RLE8) {
	      repcount = 1;
	      color = -1;
            }

	    if (repcount == 0) {
	      while (align > 0) {
	        align --;
		getc(fp);
              }

	      if ((repcount = getc(fp)) == 0) {
		if ((repcount = getc(fp)) == 0) {
		  // End of line...
                  x ++;
		  continue;
		} else if (repcount == 1) {
		  // End of image...
		  break;
		} else if (repcount == 2) {
		  // Delta...
		  repcount = getc(fp) * getc(fp) * w();
		  color = 0;
		} else {
		  // Absolute...
		  color = -1;
		  align = (2 - (repcount & 1)) & 1;
		}
	      } else {
	        color = getc(fp);
              }
            }

            // Get a new color as needed...
            if (color < 0) temp = getc(fp);
	    else temp = color;

            repcount --;

            // Copy the color value...
	    *ptr++ = colormap[temp][2];
	    *ptr++ = colormap[temp][1];
	    *ptr++ = colormap[temp][0];
	    if (havemask) ptr++;
	  }

	  if (!compression) {
            // Read remaining bytes to align to 32 bits...
	    for (temp = w(); temp & 3; temp ++) {
	      getc(fp);
	    }
	  }
          break;

      case 16 : // 16-bit 5:5:5 or 5:6:5 RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    uchar b = getc(fp), a = getc(fp) ;
	    if (use_5_6_5) {
		ptr[2] = (uchar)(( b << 3 ) & 0xf8);
		ptr[1] = (uchar)(((a << 5) & 0xe0) | ((b >> 3) & 0x1c));
		ptr[0] = (uchar)(a & 0xf8);
	    } else {
		ptr[2] = (uchar)((b << 3) & 0xf8);
		ptr[1] = (uchar)(((a << 6) & 0xc0) | ((b >> 2) & 0x38));
		ptr[0] = (uchar)((a<<1) & 0xf8);
	    }
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 2; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;

      case 24 : // 24-bit RGB
          for (x = w(); x > 0; x --, ptr += bDepth) {
	    ptr[2] = (uchar)getc(fp);
	    ptr[1] = (uchar)getc(fp);
	    ptr[0] = (uchar)getc(fp);
	  }

          // Read remaining bytes to align to 32 bits...
	  for (temp = w() * 3; temp & 3; temp ++) {
	    getc(fp);
	  }
          break;
		  
      case 32 : // 32-bit RGBA
         for (x = w(); x > 0; x --, ptr += bDepth) {
            ptr[2] = (uchar)getc(fp);
            ptr[1] = (uchar)getc(fp);
            ptr[0] = (uchar)getc(fp);
            ptr[3] = (uchar)getc(fp);
          }
          break;
    }
  }
  
  if (havemask) {
    for (y = h() - 1; y >= 0; y --) {
      ptr = (uchar *)array + y * w() * d() + 3;
      for (x = w(), bit = 128; x > 0; x --, ptr+=bDepth) {
	if (bit == 128) byte = (uchar)getc(fp);
	if (byte & bit)
	  *ptr = 0;
	else
	  *ptr = 255;
	if (bit > 1)
	  bit >>= 1;
	else
	  bit = 128;
      }
      // Read remaining bytes to align to 32 bits...
      for (temp = (w() + 7) / 8; temp & 3; temp ++)
	getc(fp);
    }
  }

  // Close the file and return...
  fclose(fp);
}